

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  element_type *peVar3;
  int iVar4;
  Recognition *this;
  long lVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  long statusCode;
  string imgPath3;
  shared_ptr<TUPU::TImage> timg;
  string result;
  string imgPath4;
  string imgUrl;
  string imgPath1;
  string secretId;
  string imgPath2;
  vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_> images3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  images2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  images1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  sequenceIds;
  long local_1e0;
  string local_1d8;
  undefined1 *local_1b8 [2];
  undefined1 local_1a8 [16];
  value_type local_198;
  string local_188;
  undefined1 local_168 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  undefined1 local_138 [16];
  undefined1 *local_128;
  long local_120;
  undefined1 local_118 [16];
  undefined1 *local_108;
  long local_100;
  undefined1 local_f8 [16];
  string local_e8;
  undefined1 *local_c8;
  long local_c0;
  undefined1 local_b8 [16];
  vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_> local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"your_secret_id","");
  this = (Recognition *)operator_new(0x88);
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1d8,"Path-of-Your-PKCS8-Private-Key","");
  TUPU::Recognition::Recognition(this,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  local_188._M_string_length = 0;
  local_188.field_2._M_local_buf[0] = '\0';
  local_1e0 = 0;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Funny","");
  __l._M_len = 1;
  __l._M_array = &local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_60,__l,(allocator_type *)&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"SequenceA","");
  __l_00._M_len = 1;
  __l_00._M_array = &local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_48,__l_00,(allocator_type *)&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  gettimeofday((timeval *)&local_1d8,(__timezone_ptr_t)0x0);
  sVar2 = local_1d8._M_string_length;
  lVar5 = (long)local_1d8._M_dataplus._M_p * 1000;
  local_128 = local_118;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_128,"http://www.yourdomain.com/img/1.jpg","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_128,local_128 + local_120);
  __l_01._M_len = 1;
  __l_01._M_array = &local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,__l_01,(allocator_type *)&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  iVar4 = TUPU::Recognition::performWithURL
                    (this,&local_e8,&local_188,&local_1e0,&local_78,&local_60,&local_48);
  printResult("using image URL with tag & sequenceId",iVar4,local_1e0,&local_188,
              (long)sVar2 / 1000 + lVar5);
  local_108 = local_f8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"/home/user/img/1.jpg","");
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"/home/user/img/2.jpg","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_1d8,local_108,local_108 + local_100);
  local_1b8[0] = local_1a8;
  std::__cxx11::string::_M_construct<char*>((string *)local_1b8,local_c8,local_c8 + local_c0);
  __l_02._M_len = 2;
  __l_02._M_array = &local_1d8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_90,__l_02,(allocator_type *)local_168);
  lVar5 = 0;
  do {
    if (local_1a8 + lVar5 != *(undefined1 **)((long)local_1b8 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_1b8 + lVar5));
    }
    lVar5 = lVar5 + -0x20;
  } while (lVar5 != -0x40);
  gettimeofday((timeval *)&local_1d8,(__timezone_ptr_t)0x0);
  sVar2 = local_1d8._M_string_length;
  _Var1._M_p = local_1d8._M_dataplus._M_p;
  local_1d8.field_2._M_allocated_capacity = 0;
  local_1d8._M_dataplus._M_p = (pointer)0x0;
  local_1d8._M_string_length = 0;
  local_168._16_8_ = (pointer)0x0;
  local_168._0_8_ = (pointer)0x0;
  local_168._8_8_ = (pointer)0x0;
  iVar4 = TUPU::Recognition::performWithPath
                    (this,&local_e8,&local_188,&local_1e0,&local_90,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_1d8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_1d8);
  printResult("using image path",iVar4,local_1e0,&local_188,
              (long)_Var1._M_p * 1000 + (long)sVar2 / 1000);
  gettimeofday((timeval *)&local_1d8,(__timezone_ptr_t)0x0);
  sVar2 = local_1d8._M_string_length;
  lVar5 = (long)local_1d8._M_dataplus._M_p * 1000;
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"/home/user/img/3.jpg","");
  local_168._0_8_ = (pointer)(local_168 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"/home/user/img/4.jpg","");
  local_a8.
  super__Vector_base<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  loadImage(&local_a8,local_1d8._M_dataplus._M_p,"Room102","xxx111");
  local_198.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (TImage *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<TUPU::TImage,std::allocator<TUPU::TImage>>
            (&local_198.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (TImage **)&local_198,(allocator<TUPU::TImage> *)&local_148);
  TUPU::TImage::setPath
            (local_198.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (string *)local_168);
  peVar3 = local_198.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_148._M_allocated_capacity = (size_type)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Room103","");
  std::__cxx11::string::_M_assign((string *)&peVar3->m_tag);
  if ((undefined1 *)local_148._M_allocated_capacity != local_138) {
    operator_delete((void *)local_148._M_allocated_capacity);
  }
  peVar3 = local_198.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_148._M_allocated_capacity = (size_type)local_138;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"xxx123","");
  std::__cxx11::string::_M_assign((string *)&peVar3->m_sequenceId);
  if ((undefined1 *)local_148._M_allocated_capacity != local_138) {
    operator_delete((void *)local_148._M_allocated_capacity);
  }
  std::vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>::
  push_back(&local_a8,&local_198);
  iVar4 = TUPU::Recognition::perform(this,&local_e8,&local_a8,&local_188,&local_1e0);
  printResult("using image binary with tag & sequenceId",iVar4,local_1e0,&local_188,
              (long)sVar2 / 1000 + lVar5);
  (*this->_vptr_Recognition[1])(this);
  if (local_198.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_198.super___shared_ptr<TUPU::TImage,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  std::vector<std::shared_ptr<TUPU::TImage>,_std::allocator<std::shared_ptr<TUPU::TImage>_>_>::
  ~vector(&local_a8);
  if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
    operator_delete((void *)local_168._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_90);
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  if (local_108 != local_f8) {
    operator_delete(local_108);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  if (local_128 != local_118) {
    operator_delete(local_128);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    string secretId = "your_secret_id";
    Recognition *rec = new Recognition("Path-of-Your-PKCS8-Private-Key");

    //Set sub-user identifier for billing and statistics (optional feature)
    // int rs = rec->setUID("user-bucket-xyz");
    // if (rs != 0) {
    //     return rs;
    // }

    string result;
    long statusCode = 0;
    int rc = 0;
    vector<string> tags = {"Funny"}; //number of tags may be less than number of images
    vector<string> sequenceIds = {"SequenceA"}; //number of sequenceIds may be less than number of images
    long start = getTime();

    /*********** imageUrl *****************/
    //Providing URLs of images with tags & sequenceIds (optional)
    string imgUrl = "http://www.yourdomain.com/img/1.jpg";
    vector<string> images1 = { imgUrl };
    rc = rec->performWithURL(secretId, result, &statusCode, images1, tags, sequenceIds);
    printResult("using image URL with tag & sequenceId", rc, statusCode, result, start);
    /*************************************/

    /*********** imagePath *****************/
    string imgPath1 = "/home/user/img/1.jpg";
    string imgPath2 = "/home/user/img/2.jpg";
    vector<string> images2 = { imgPath1, imgPath2 };
    start = getTime();
    //Providing paths of images without tags (optional)
    rc = rec->performWithPath(secretId, result, &statusCode, images2);
    printResult("using image path", rc, statusCode, result, start);
    /*************************************/

    /*********** imageContent *****************/
    start = getTime();
    // Providing image binary and path
    string imgPath3 = "/home/user/img/3.jpg";
    string imgPath4 = "/home/user/img/4.jpg";
    vector<shared_ptr<TImage>> images3;
    loadImage(images3, imgPath3.c_str(), "Room102", "xxx111");
    shared_ptr<TImage> timg = std::make_shared<TImage>();
    timg->setPath(imgPath4);
    timg->setTag("Room103");
    timg->setSequenceId("xxx123");
    images3.push_back(timg);
    rc = rec->perform(secretId, images3, result, &statusCode);
    printResult("using image binary with tag & sequenceId", rc, statusCode, result, start);
    /*************************************/

    delete rec;

    return 0;
}